

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

int blake2b_compress(hash_state *md,uchar *buf)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong64 m [16];
  ulong local_1c8 [8];
  ulong local_188 [10];
  long local_138 [33];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_138[lVar1] = *(long *)(buf + lVar1 * 8);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_1c8[lVar1] = *(ulong *)((long)md + lVar1 * 8);
  }
  uVar2 = local_1c8[0] + local_1c8[4] + local_138[0];
  uVar4 = (md->whirlpool).state[7] ^ uVar2 ^ 0x510e527fade682d1;
  uVar8 = local_1c8[2] + local_1c8[6] + local_138[4];
  uVar7 = local_1c8[1] + local_1c8[5] + local_138[2];
  uVar9 = local_1c8[3] + local_1c8[7] + local_138[6];
  uVar14 = (md->sha3).s[8] ^ uVar7 ^ 0x9b05688c2b3e6c1f;
  uVar10 = (md->sha3).s[9] ^ uVar8 ^ 0x1f83d9abfb41bd6b;
  uVar6 = (md->sha3).s[10] ^ uVar9 ^ 0x5be0cd19137e2179;
  uVar5 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[0] = uVar5 + 0x6a09e667f3bcc908;
  uVar4 = local_1c8[4] ^ local_188[0];
  uVar3 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar4 = uVar2 + local_138[1] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar14 = uVar14 >> 0x20 | uVar14 << 0x20;
  local_188[1] = uVar14 + 0xbb67ae8584caa73b;
  uVar2 = local_1c8[5] ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar7 = uVar7 + local_138[3] + uVar2;
  uVar14 = uVar14 ^ uVar7;
  uVar15 = uVar14 >> 0x10 | uVar14 << 0x30;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[2] = uVar10 + 0x3c6ef372fe94f82b;
  uVar14 = local_1c8[6] ^ local_188[2];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar8 = uVar8 + local_138[5] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[3] = uVar6 + 0xa54ff53a5f1d36f1;
  uVar11 = local_1c8[7] ^ local_188[3];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar9 = uVar9 + local_138[7] + uVar11;
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar4 = uVar4 + local_138[8] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar4 = uVar4 + local_138[9] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = local_188[2] + uVar6;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar7 = uVar7 + local_138[10] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar7 = uVar7 + local_138[0xb] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar8 = uVar8 + local_138[0xc] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[0] = local_188[0] + uVar15;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar8 = uVar8 + local_138[0xd] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[0] = local_188[0] + uVar15;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar8 = uVar8 + local_138[9] + uVar14;
  uVar9 = uVar9 + local_138[0xe] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[1] = local_188[1] + uVar10;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[0xf] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[1] = local_188[1] + uVar10;
  uVar10 = uVar10 ^ uVar8;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar4 = uVar4 + local_138[0xe] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[0xd] + uVar11;
  uVar6 = uVar6 ^ uVar9;
  uVar4 = uVar4 + local_138[10] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar7 = uVar7 + local_138[4] + uVar2;
  uVar15 = uVar15 ^ uVar7;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar7 = uVar7 + local_138[8] + uVar2;
  uVar15 = uVar15 ^ uVar7;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar4 = uVar4 + local_138[1] + uVar2;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar8 = uVar8 + local_138[0xf] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar7 = uVar7 + local_138[0] + uVar14;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar9 = uVar9 + local_138[6] + uVar11;
  uVar5 = uVar5 ^ uVar7;
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar6 = uVar6 ^ uVar4;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  uVar8 = uVar8 + local_138[0xb] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar9 = uVar9 + local_138[5] + uVar3;
  local_188[2] = local_188[2] + uVar6;
  uVar10 = uVar10 ^ uVar9;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar4 = uVar4 + local_138[0xc] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = local_188[2] + uVar6;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar7 = uVar7 + local_138[2] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  uVar7 = uVar7 + local_138[0xc] + uVar2;
  local_188[0] = local_188[0] + uVar15;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar8 = uVar8 + local_138[7] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[0] = local_188[0] + uVar15;
  uVar15 = uVar15 ^ uVar7;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar8 = uVar8 + local_138[5] + uVar14;
  local_188[1] = local_188[1] + uVar10;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[3] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[1] = local_188[1] + uVar10;
  uVar10 = uVar10 ^ uVar8;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar4 = uVar4 + local_138[0xb] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  uVar9 = uVar9 + local_138[0xf] + uVar11;
  local_188[0] = local_188[0] + uVar5;
  uVar6 = uVar6 ^ uVar9;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar4 = uVar4 + local_138[8] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar7 = uVar7 + local_138[0] + uVar2;
  uVar15 = uVar15 ^ uVar7;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar4 = uVar4 + local_138[10] + uVar2;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar8 = uVar8 + local_138[2] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar7 = uVar7 + local_138[3] + uVar14;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar9 = uVar9 + local_138[0xd] + uVar11;
  uVar5 = uVar5 ^ uVar7;
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar6 = uVar6 ^ uVar4;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  uVar8 = uVar8 + local_138[7] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar9 = uVar9 + local_138[9] + uVar3;
  local_188[2] = local_188[2] + uVar6;
  uVar10 = uVar10 ^ uVar9;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar4 = uVar4 + local_138[0xe] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = local_188[2] + uVar6;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar7 = uVar7 + local_138[6] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  uVar7 = uVar7 + local_138[3] + uVar2;
  local_188[0] = local_188[0] + uVar15;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar8 = uVar8 + local_138[1] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[0] = local_188[0] + uVar15;
  uVar15 = uVar15 ^ uVar7;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[1] = local_188[1] + uVar10;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[4] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[1] = local_188[1] + uVar10;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar4 = uVar4 + local_138[7] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  uVar8 = uVar8 + local_138[0xd] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  local_188[0] = local_188[0] + uVar5;
  uVar9 = uVar9 + local_138[0xb] + uVar11;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar6 = uVar6 ^ uVar9;
  uVar4 = uVar4 + local_138[9] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar7 = uVar7 + local_138[1] + uVar2;
  uVar15 = uVar15 ^ uVar7;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[1] = local_188[1] + uVar15;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  uVar4 = uVar4 + local_138[2] + uVar2;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar8 = uVar8 + local_138[0xc] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar9 = uVar9 + local_138[0xe] + uVar11;
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar6 = uVar6 ^ uVar4;
  uVar11 = uVar11 ^ local_188[3];
  uVar11 = uVar11 >> 0x3f | uVar11 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  uVar8 = uVar8 + local_138[4] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  local_188[2] = local_188[2] + uVar6;
  uVar9 = uVar9 + local_138[0xf] + uVar3;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar4 = uVar4 + local_138[6] + uVar2;
  uVar10 = uVar10 ^ uVar9;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = local_188[2] + uVar6;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar7 = uVar7 + local_138[5] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar7 = uVar7 + local_138[10] + uVar14;
  uVar5 = uVar5 ^ uVar7;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar14 = uVar14 ^ local_188[3];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar15 = uVar15 >> 0x20 | uVar15 << 0x20;
  uVar7 = uVar7 + local_138[5] + uVar2;
  local_188[0] = local_188[0] + uVar15;
  uVar11 = uVar11 ^ local_188[0];
  uVar11 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar8 = uVar8 + local_138[0] + uVar11;
  uVar15 = uVar15 ^ uVar8;
  uVar15 = uVar15 >> 0x10 | uVar15 << 0x30;
  local_188[0] = local_188[0] + uVar15;
  uVar15 = uVar15 ^ uVar7;
  uVar11 = uVar11 ^ local_188[0];
  uVar12 = uVar11 >> 0x3f | uVar11 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[1] = local_188[1] + uVar10;
  uVar8 = uVar8 + local_138[2] + uVar14;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[8] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[1] = local_188[1] + uVar10;
  uVar10 = uVar10 ^ uVar8;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar4 = uVar4 + local_138[9] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar9 = uVar9 + local_138[10] + uVar12;
  uVar6 = uVar6 ^ uVar9;
  uVar4 = uVar4 + local_138[0] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar5;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar11 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[1] = local_188[1] + uVar11;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar7 = uVar7 + local_138[7] + uVar2;
  uVar11 = uVar11 ^ uVar7;
  uVar16 = uVar11 >> 0x10 | uVar11 << 0x30;
  local_188[1] = local_188[1] + uVar16;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[2] = local_188[2] + uVar10;
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar8 = uVar8 + local_138[4] + uVar14;
  uVar10 = uVar10 ^ uVar8;
  uVar11 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = local_188[2] + uVar11;
  uVar14 = uVar14 ^ local_188[2];
  uVar15 = uVar14 >> 0x3f | uVar14 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  uVar7 = uVar7 + local_138[0xb] + uVar15;
  uVar5 = uVar5 ^ uVar7;
  local_188[3] = local_188[3] + uVar6;
  uVar12 = uVar12 ^ local_188[3];
  uVar10 = uVar12 >> 0x18 | uVar12 << 0x28;
  uVar9 = uVar9 + local_138[0xf] + uVar10;
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar10 = uVar10 ^ local_188[3];
  uVar12 = uVar10 >> 0x3f | uVar10 << 1;
  uVar10 = uVar8 + local_138[6] + uVar12;
  uVar16 = uVar16 ^ uVar10;
  uVar4 = uVar4 + local_138[0xe] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar14 = uVar9 + local_138[3] + uVar3;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar11 = uVar11 ^ uVar14;
  uVar4 = uVar4 + local_138[1] + uVar2;
  uVar6 = uVar6 ^ uVar4;
  uVar8 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = local_188[2] + uVar8;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar15 = uVar15 ^ local_188[3];
  uVar9 = uVar15 >> 0x18 | uVar15 << 0x28;
  uVar6 = uVar7 + local_138[0xc] + uVar9;
  uVar5 = uVar5 ^ uVar6;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar9 = uVar9 ^ local_188[3];
  uVar15 = uVar9 >> 0x3f | uVar9 << 1;
  uVar16 = uVar16 >> 0x20 | uVar16 << 0x20;
  uVar9 = uVar6 + local_138[6] + uVar2;
  local_188[0] = local_188[0] + uVar16;
  uVar12 = uVar12 ^ local_188[0];
  uVar7 = uVar12 >> 0x18 | uVar12 << 0x28;
  uVar6 = uVar10 + local_138[8] + uVar7;
  uVar16 = uVar16 ^ uVar6;
  uVar16 = uVar16 >> 0x10 | uVar16 << 0x30;
  local_188[0] = local_188[0] + uVar16;
  uVar16 = uVar16 ^ uVar9;
  uVar7 = uVar7 ^ local_188[0];
  uVar12 = uVar7 >> 0x3f | uVar7 << 1;
  uVar7 = uVar11 >> 0x20 | uVar11 << 0x20;
  uVar10 = uVar6 + local_138[0] + uVar15;
  local_188[1] = local_188[1] + uVar7;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar6 = uVar14 + local_138[0xd] + uVar3;
  uVar7 = uVar7 ^ uVar6;
  uVar14 = uVar7 >> 0x10 | uVar7 << 0x30;
  local_188[1] = local_188[1] + uVar14;
  uVar14 = uVar14 ^ uVar10;
  uVar3 = uVar3 ^ local_188[1];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar4 = uVar4 + local_138[2] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  uVar11 = uVar6 + local_138[8] + uVar12;
  local_188[0] = local_188[0] + uVar5;
  uVar8 = uVar8 ^ uVar11;
  uVar3 = uVar3 ^ local_188[0];
  uVar3 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar4 = uVar4 + local_138[0xc] + uVar3;
  uVar5 = uVar5 ^ uVar4;
  uVar7 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = local_188[0] + uVar7;
  uVar3 = uVar3 ^ local_188[0];
  uVar6 = uVar3 >> 0x3f | uVar3 << 1;
  uVar3 = uVar16 >> 0x20 | uVar16 << 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar5 = uVar9 + local_138[10] + uVar2;
  uVar3 = uVar3 ^ uVar5;
  uVar16 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[1] = local_188[1] + uVar16;
  uVar2 = uVar2 ^ local_188[1];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar3 = uVar14 >> 0x20 | uVar14 << 0x20;
  local_188[2] = local_188[2] + uVar3;
  uVar15 = uVar15 ^ local_188[2];
  uVar9 = uVar15 >> 0x18 | uVar15 << 0x28;
  uVar14 = uVar10 + local_138[0xb] + uVar9;
  uVar3 = uVar3 ^ uVar14;
  uVar15 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[2] = local_188[2] + uVar15;
  uVar9 = uVar9 ^ local_188[2];
  uVar10 = uVar9 >> 0x3f | uVar9 << 1;
  uVar3 = uVar8 >> 0x20 | uVar8 << 0x20;
  uVar9 = uVar5 + uVar10 + local_138[7];
  local_188[3] = local_188[3] + uVar3;
  uVar4 = uVar4 + local_138[4] + uVar2;
  uVar7 = uVar7 ^ uVar9;
  uVar12 = uVar12 ^ local_188[3];
  uVar5 = uVar12 >> 0x18 | uVar12 << 0x28;
  uVar8 = uVar11 + local_138[3] + uVar5;
  uVar3 = uVar3 ^ uVar8;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[3] = local_188[3] + uVar3;
  uVar3 = uVar3 ^ uVar4;
  uVar5 = uVar5 ^ local_188[3];
  uVar12 = uVar5 >> 0x3f | uVar5 << 1;
  uVar5 = uVar3 >> 0x20 | uVar3 << 0x20;
  uVar11 = uVar8 + local_138[1] + uVar6;
  local_188[2] = local_188[2] + uVar5;
  uVar15 = uVar15 ^ uVar11;
  uVar2 = uVar2 ^ local_188[2];
  uVar3 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar2 = uVar4 + local_138[0xd] + uVar3;
  uVar5 = uVar5 ^ uVar2;
  uVar8 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[2] = uVar8 + local_188[2];
  uVar3 = uVar3 ^ local_188[2];
  uVar5 = uVar3 >> 0x3f | uVar3 << 1;
  uVar3 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[3] = local_188[3] + uVar3;
  uVar10 = uVar10 ^ local_188[3];
  uVar4 = uVar10 >> 0x18 | uVar10 << 0x28;
  uVar9 = uVar9 + local_138[5] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar7 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[3] = local_188[3] + uVar7;
  uVar10 = uVar9 + uVar5 + local_138[1];
  uVar4 = local_188[3] ^ uVar4;
  uVar9 = uVar14 + local_138[0xf] + uVar12;
  uVar3 = uVar4 >> 0x3f | uVar4 << 1;
  uVar16 = uVar16 ^ uVar9;
  uVar14 = uVar16 >> 0x20 | uVar16 << 0x20;
  local_188[0] = local_188[0] + uVar14;
  uVar12 = uVar12 ^ local_188[0];
  uVar12 = uVar12 >> 0x18 | uVar12 << 0x28;
  uVar4 = uVar9 + local_138[0xe] + uVar12;
  uVar14 = uVar14 ^ uVar4;
  uVar16 = uVar14 >> 0x10 | uVar14 << 0x30;
  local_188[0] = local_188[0] + uVar16;
  uVar16 = uVar16 ^ uVar10;
  uVar14 = uVar4 + uVar3 + local_138[0xe];
  uVar12 = uVar12 ^ local_188[0];
  uVar12 = uVar12 >> 0x3f | uVar12 << 1;
  uVar9 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[1] = local_188[1] + uVar9;
  uVar6 = uVar6 ^ local_188[1];
  uVar4 = uVar6 >> 0x18 | uVar6 << 0x28;
  uVar6 = uVar11 + uVar4 + local_138[9];
  uVar9 = uVar9 ^ uVar6;
  uVar15 = uVar9 >> 0x10 | uVar9 << 0x30;
  local_188[1] = local_188[1] + uVar15;
  uVar15 = uVar15 ^ uVar14;
  uVar11 = uVar6 + uVar12 + local_138[4];
  uVar4 = uVar4 ^ local_188[1];
  uVar4 = uVar4 >> 0x3f | uVar4 << 1;
  uVar9 = uVar2 + uVar4 + local_138[0xc];
  uVar7 = uVar7 ^ uVar9;
  uVar6 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[0] = local_188[0] + uVar6;
  uVar4 = uVar4 ^ local_188[0];
  uVar2 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar7 = uVar9 + local_138[5] + uVar2;
  uVar6 = uVar6 ^ uVar7;
  uVar9 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[0] = uVar9 + local_188[0];
  uVar2 = local_188[0] ^ uVar2;
  uVar6 = uVar2 >> 0x3f | uVar2 << 1;
  uVar4 = uVar16 >> 0x20 | uVar16 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar5 = uVar5 ^ local_188[1];
  uVar2 = uVar5 >> 0x18 | uVar5 << 0x28;
  uVar5 = uVar10 + local_138[0xf] + uVar2;
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = uVar4 + local_188[1];
  uVar2 = local_188[1] ^ uVar2;
  uVar17 = uVar2 >> 0x3f | uVar2 << 1;
  uVar10 = uVar15 >> 0x20 | uVar15 << 0x20;
  local_188[2] = local_188[2] + uVar10;
  uVar16 = uVar7 + uVar17 + local_138[0];
  uVar3 = uVar3 ^ local_188[2];
  uVar2 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar7 = uVar14 + uVar2 + local_138[0xd];
  uVar10 = uVar10 ^ uVar7;
  uVar3 = uVar10 >> 0x10 | uVar10 << 0x30;
  local_188[2] = uVar3 + local_188[2];
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar14 = uVar5 + uVar2 + local_138[6];
  uVar8 = uVar8 ^ uVar11;
  uVar5 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar12 = uVar12 ^ local_188[3];
  uVar8 = uVar12 >> 0x18 | uVar12 << 0x28;
  uVar12 = uVar11 + uVar8 + local_138[10];
  uVar5 = uVar5 ^ uVar12;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar5 = uVar5 ^ uVar16;
  uVar8 = uVar8 ^ local_188[3];
  uVar13 = uVar8 >> 0x3f | uVar8 << 1;
  uVar5 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[2] = local_188[2] + uVar5;
  uVar15 = uVar7 + uVar13 + local_138[9];
  uVar17 = uVar17 ^ local_188[2];
  uVar7 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar16 = uVar16 + uVar7 + local_138[7];
  uVar5 = uVar5 ^ uVar16;
  uVar10 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[2] = uVar10 + local_188[2];
  uVar7 = local_188[2] ^ uVar7;
  uVar8 = uVar7 >> 0x3f | uVar7 << 1;
  uVar9 = uVar9 ^ uVar14;
  uVar5 = uVar9 >> 0x20 | uVar9 << 0x20;
  local_188[3] = local_188[3] + uVar5;
  uVar2 = uVar2 ^ local_188[3];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar11 = uVar14 + uVar2 + local_138[3];
  uVar5 = uVar5 ^ uVar11;
  uVar5 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[3] = local_188[3] + uVar5;
  uVar2 = local_188[3] ^ uVar2;
  uVar2 = uVar2 >> 0x3f | uVar2 << 1;
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar13 = uVar13 ^ local_188[0];
  uVar7 = uVar13 >> 0x18 | uVar13 << 0x28;
  uVar15 = uVar15 + uVar7 + local_138[2];
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[0] = local_188[0] + uVar4;
  uVar7 = uVar7 ^ local_188[0];
  uVar14 = uVar7 >> 0x3f | uVar7 << 1;
  uVar7 = uVar12 + uVar6 + local_138[8];
  uVar3 = uVar3 ^ uVar7;
  uVar3 = uVar3 >> 0x20 | uVar3 << 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar6 = uVar6 ^ local_188[1];
  uVar9 = uVar6 >> 0x18 | uVar6 << 0x28;
  uVar12 = uVar7 + local_138[0xb] + uVar9;
  uVar3 = uVar3 ^ uVar12;
  uVar6 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[1] = local_188[1] + uVar6;
  uVar9 = uVar9 ^ local_188[1];
  uVar9 = uVar9 >> 0x3f | uVar9 << 1;
  uVar7 = uVar16 + uVar9 + local_138[0xd];
  uVar5 = uVar5 ^ uVar7;
  uVar3 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar9 = uVar9 ^ local_188[0];
  uVar5 = uVar9 >> 0x18 | uVar9 << 0x28;
  uVar16 = uVar7 + local_138[0xb] + uVar5;
  uVar3 = uVar3 ^ uVar16;
  uVar9 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[0] = uVar9 + local_188[0];
  uVar5 = local_188[0] ^ uVar5;
  uVar7 = uVar5 >> 0x3f | uVar5 << 1;
  uVar5 = uVar11 + uVar8 + local_138[7];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar8 = uVar8 ^ local_188[1];
  uVar3 = uVar8 >> 0x18 | uVar8 << 0x28;
  uVar8 = uVar5 + uVar3 + local_138[0xe];
  uVar4 = uVar4 ^ uVar8;
  uVar5 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = uVar5 + local_188[1];
  uVar3 = local_188[1] ^ uVar3;
  uVar4 = uVar3 >> 0x3f | uVar3 << 1;
  uVar13 = uVar16 + uVar4 + local_138[5];
  uVar11 = uVar15 + uVar2 + local_138[0xc];
  uVar6 = uVar6 ^ uVar11;
  uVar3 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[2] = local_188[2] + uVar3;
  uVar2 = uVar2 ^ local_188[2];
  uVar2 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar11 = uVar11 + uVar2 + local_138[1];
  uVar3 = uVar3 ^ uVar11;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[2] = uVar3 + local_188[2];
  uVar2 = uVar2 ^ local_188[2];
  uVar17 = uVar2 >> 0x3f | uVar2 << 1;
  uVar15 = uVar12 + uVar14 + local_138[3];
  uVar10 = uVar10 ^ uVar15;
  uVar2 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[3] = local_188[3] + uVar2;
  uVar14 = uVar14 ^ local_188[3];
  uVar6 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar16 = uVar15 + uVar6 + local_138[9];
  uVar2 = uVar2 ^ uVar16;
  uVar2 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[3] = local_188[3] + uVar2;
  uVar2 = uVar2 ^ uVar13;
  uVar6 = uVar6 ^ local_188[3];
  uVar14 = uVar6 >> 0x3f | uVar6 << 1;
  uVar6 = uVar2 >> 0x20 | uVar2 << 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar12 = uVar11 + uVar14 + local_138[8];
  uVar4 = uVar4 ^ local_188[2];
  uVar2 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar13 = uVar13 + uVar2 + local_138[0];
  uVar6 = uVar6 ^ uVar13;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = uVar6 + local_188[2];
  uVar2 = local_188[2] ^ uVar2;
  uVar10 = uVar2 >> 0x3f | uVar2 << 1;
  uVar4 = uVar8 + local_138[0xf] + uVar17;
  uVar9 = uVar9 ^ uVar4;
  uVar2 = uVar9 >> 0x20 | uVar9 << 0x20;
  local_188[3] = local_188[3] + uVar2;
  uVar17 = uVar17 ^ local_188[3];
  uVar9 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar15 = uVar4 + uVar9 + local_138[4];
  uVar2 = uVar2 ^ uVar15;
  uVar8 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[3] = local_188[3] + uVar8;
  uVar9 = local_188[3] ^ uVar9;
  uVar11 = uVar9 >> 0x3f | uVar9 << 1;
  uVar5 = uVar5 ^ uVar12;
  uVar2 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar14 = uVar14 ^ local_188[0];
  uVar4 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar12 = uVar12 + local_138[6] + uVar4;
  uVar2 = uVar2 ^ uVar12;
  uVar2 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[0] = local_188[0] + uVar2;
  uVar4 = uVar4 ^ local_188[0];
  uVar9 = uVar4 >> 0x3f | uVar4 << 1;
  uVar14 = uVar16 + uVar7 + local_138[2];
  uVar3 = uVar3 ^ uVar14;
  uVar4 = uVar3 >> 0x20 | uVar3 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar7 = uVar7 ^ local_188[1];
  uVar5 = uVar7 >> 0x18 | uVar7 << 0x28;
  uVar16 = uVar14 + uVar5 + local_138[10];
  uVar4 = uVar4 ^ uVar16;
  uVar3 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = local_188[1] + uVar3;
  uVar5 = uVar5 ^ local_188[1];
  uVar5 = uVar5 >> 0x3f | uVar5 << 1;
  uVar7 = uVar13 + local_138[6] + uVar5;
  uVar8 = uVar8 ^ uVar7;
  uVar4 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 >> 0x18 | uVar5 << 0x28;
  uVar13 = uVar7 + local_138[0xf] + uVar5;
  uVar4 = uVar4 ^ uVar13;
  uVar7 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[0] = uVar7 + local_188[0];
  uVar5 = local_188[0] ^ uVar5;
  uVar8 = uVar5 >> 0x3f | uVar5 << 1;
  uVar5 = uVar15 + uVar10 + local_138[0xe];
  uVar2 = uVar2 ^ uVar5;
  uVar2 = uVar2 >> 0x20 | uVar2 << 0x20;
  local_188[1] = local_188[1] + uVar2;
  uVar10 = uVar10 ^ local_188[1];
  uVar4 = uVar10 >> 0x18 | uVar10 << 0x28;
  uVar14 = uVar5 + uVar4 + local_138[9];
  uVar2 = uVar2 ^ uVar14;
  uVar2 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[1] = uVar2 + local_188[1];
  uVar4 = local_188[1] ^ uVar4;
  uVar4 = uVar4 >> 0x3f | uVar4 << 1;
  uVar13 = uVar13 + uVar4 + local_138[0xc];
  uVar5 = uVar12 + uVar11 + local_138[0xb];
  uVar3 = uVar3 ^ uVar5;
  uVar3 = uVar3 >> 0x20 | uVar3 << 0x20;
  local_188[2] = local_188[2] + uVar3;
  uVar11 = uVar11 ^ local_188[2];
  uVar10 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar11 = uVar5 + uVar10 + local_138[3];
  uVar3 = uVar3 ^ uVar11;
  uVar5 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[2] = uVar5 + local_188[2];
  uVar10 = uVar10 ^ local_188[2];
  uVar10 = uVar10 >> 0x3f | uVar10 << 1;
  uVar15 = uVar14 + uVar10 + local_138[0xd];
  uVar14 = uVar16 + uVar9 + local_138[0];
  uVar6 = uVar6 ^ uVar14;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar9 = uVar9 ^ local_188[3];
  uVar3 = uVar9 >> 0x18 | uVar9 << 0x28;
  uVar16 = uVar14 + uVar3 + local_138[8];
  uVar6 = uVar6 ^ uVar16;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar6 = uVar6 ^ uVar13;
  uVar3 = uVar3 ^ local_188[3];
  uVar9 = uVar3 >> 0x3f | uVar3 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar12 = uVar11 + uVar9 + local_138[1];
  uVar4 = uVar4 ^ local_188[2];
  uVar4 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar3 = uVar13 + uVar4 + local_138[2];
  uVar6 = uVar6 ^ uVar3;
  uVar11 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = uVar11 + local_188[2];
  uVar4 = local_188[2] ^ uVar4;
  uVar14 = uVar4 >> 0x3f | uVar4 << 1;
  uVar7 = uVar7 ^ uVar15;
  uVar4 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[3] = local_188[3] + uVar4;
  uVar10 = uVar10 ^ local_188[3];
  uVar6 = uVar10 >> 0x18 | uVar10 << 0x28;
  uVar15 = uVar15 + uVar6 + local_138[7];
  uVar4 = uVar4 ^ uVar15;
  uVar10 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[3] = local_188[3] + uVar10;
  uVar6 = local_188[3] ^ uVar6;
  uVar6 = uVar6 >> 0x3f | uVar6 << 1;
  uVar2 = uVar2 ^ uVar12;
  uVar2 = uVar2 >> 0x20 | uVar2 << 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar9 = uVar9 ^ local_188[0];
  uVar7 = uVar9 >> 0x18 | uVar9 << 0x28;
  uVar12 = uVar12 + local_138[4] + uVar7;
  uVar2 = uVar2 ^ uVar12;
  uVar4 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[0] = local_188[0] + uVar4;
  uVar7 = uVar7 ^ local_188[0];
  uVar7 = uVar7 >> 0x3f | uVar7 << 1;
  uVar9 = uVar16 + uVar8 + local_138[10];
  uVar5 = uVar5 ^ uVar9;
  uVar2 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[1] = local_188[1] + uVar2;
  uVar8 = uVar8 ^ local_188[1];
  uVar5 = uVar8 >> 0x18 | uVar8 << 0x28;
  uVar13 = uVar9 + uVar5 + local_138[5];
  uVar2 = uVar2 ^ uVar13;
  uVar8 = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[1] = local_188[1] + uVar8;
  uVar5 = uVar5 ^ local_188[1];
  uVar2 = uVar5 >> 0x3f | uVar5 << 1;
  uVar3 = local_138[10] + uVar2 + uVar3;
  uVar10 = uVar10 ^ uVar3;
  uVar5 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[0] = local_188[0] + uVar5;
  uVar2 = uVar2 ^ local_188[0];
  uVar9 = uVar2 >> 0x18 | uVar2 << 0x28;
  uVar2 = uVar3 + uVar9 + local_138[2];
  uVar5 = uVar5 ^ uVar2;
  uVar10 = uVar5 >> 0x10 | uVar5 << 0x30;
  local_188[0] = uVar10 + local_188[0];
  uVar9 = local_188[0] ^ uVar9;
  uVar9 = uVar9 >> 0x3f | uVar9 << 1;
  uVar5 = uVar15 + uVar14 + local_138[8];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar14 = uVar14 ^ local_188[1];
  uVar3 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar14 = uVar5 + local_138[4] + uVar3;
  uVar4 = uVar4 ^ uVar14;
  uVar5 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = uVar5 + local_188[1];
  uVar3 = local_188[1] ^ uVar3;
  uVar4 = uVar3 >> 0x3f | uVar3 << 1;
  uVar2 = uVar2 + uVar4 + local_138[0xf];
  uVar15 = uVar12 + uVar6 + local_138[7];
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[2] = local_188[2] + uVar8;
  uVar6 = uVar6 ^ local_188[2];
  uVar3 = uVar6 >> 0x18 | uVar6 << 0x28;
  uVar16 = uVar15 + uVar3 + local_138[6];
  uVar8 = uVar8 ^ uVar16;
  uVar8 = uVar8 >> 0x10 | uVar8 << 0x30;
  local_188[2] = uVar8 + local_188[2];
  uVar3 = uVar3 ^ local_188[2];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar15 = uVar14 + uVar3 + local_138[9];
  uVar14 = uVar13 + uVar7 + local_138[1];
  uVar11 = uVar11 ^ uVar14;
  uVar6 = uVar11 >> 0x20 | uVar11 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar7 = uVar7 ^ local_188[3];
  uVar7 = uVar7 >> 0x18 | uVar7 << 0x28;
  uVar13 = uVar14 + uVar7 + local_138[5];
  uVar6 = uVar6 ^ uVar13;
  uVar6 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar6;
  uVar6 = uVar6 ^ uVar2;
  uVar7 = uVar7 ^ local_188[3];
  uVar7 = uVar7 >> 0x3f | uVar7 << 1;
  uVar6 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[2] = local_188[2] + uVar6;
  uVar4 = uVar4 ^ local_188[2];
  uVar4 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar2 = uVar2 + uVar4 + local_138[0xb];
  uVar6 = uVar6 ^ uVar2;
  uVar11 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[2] = uVar11 + local_188[2];
  uVar4 = local_188[2] ^ uVar4;
  uVar14 = uVar4 >> 0x3f | uVar4 << 1;
  uVar10 = uVar10 ^ uVar15;
  uVar6 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[3] = local_188[3] + uVar6;
  uVar3 = uVar3 ^ local_188[3];
  uVar4 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar12 = uVar15 + uVar4 + local_138[0xe];
  uVar6 = uVar6 ^ uVar12;
  uVar10 = uVar6 >> 0x10 | uVar6 << 0x30;
  local_188[3] = local_188[3] + uVar10;
  uVar4 = local_188[3] ^ uVar4;
  uVar6 = uVar4 >> 0x3f | uVar4 << 1;
  uVar15 = uVar16 + local_138[3] + uVar7;
  uVar5 = uVar5 ^ uVar15;
  uVar4 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar7 = uVar7 ^ local_188[0];
  uVar3 = uVar7 >> 0x18 | uVar7 << 0x28;
  uVar16 = uVar15 + uVar3 + local_138[0xc];
  uVar4 = uVar4 ^ uVar16;
  uVar4 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[0] = local_188[0] + uVar4;
  uVar3 = uVar3 ^ local_188[0];
  uVar15 = uVar3 >> 0x3f | uVar3 << 1;
  uVar7 = uVar13 + uVar9 + local_138[0xd];
  uVar8 = uVar8 ^ uVar7;
  uVar3 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar9 = uVar9 ^ local_188[1];
  uVar5 = uVar9 >> 0x18 | uVar9 << 0x28;
  uVar13 = uVar7 + local_138[0] + uVar5;
  uVar3 = uVar3 ^ uVar13;
  uVar7 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[1] = local_188[1] + uVar7;
  uVar5 = uVar5 ^ local_188[1];
  uVar5 = uVar5 >> 0x3f | uVar5 << 1;
  uVar2 = uVar2 + local_138[0] + uVar5;
  uVar10 = uVar10 ^ uVar2;
  uVar3 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 >> 0x18 | uVar5 << 0x28;
  uVar2 = uVar2 + uVar5 + local_138[1];
  uVar3 = uVar3 ^ uVar2;
  uVar10 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[0] = uVar10 + local_188[0];
  uVar5 = local_188[0] ^ uVar5;
  uVar8 = uVar5 >> 0x3f | uVar5 << 1;
  uVar5 = uVar12 + uVar14 + local_138[2];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar14 = uVar14 ^ local_188[1];
  uVar3 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar12 = uVar5 + local_138[3] + uVar3;
  uVar4 = uVar4 ^ uVar12;
  uVar5 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = uVar5 + local_188[1];
  uVar3 = local_188[1] ^ uVar3;
  uVar4 = uVar3 >> 0x3f | uVar3 << 1;
  uVar2 = uVar2 + uVar4 + local_138[8];
  uVar9 = uVar16 + uVar6 + local_138[4];
  uVar7 = uVar7 ^ uVar9;
  uVar7 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[2] = local_188[2] + uVar7;
  uVar6 = uVar6 ^ local_188[2];
  uVar3 = uVar6 >> 0x18 | uVar6 << 0x28;
  uVar14 = uVar9 + uVar3 + local_138[5];
  uVar7 = uVar7 ^ uVar14;
  uVar6 = uVar7 >> 0x10 | uVar7 << 0x30;
  local_188[2] = uVar6 + local_188[2];
  uVar3 = uVar3 ^ local_188[2];
  uVar3 = uVar3 >> 0x3f | uVar3 << 1;
  uVar16 = uVar13 + uVar15 + local_138[6];
  uVar11 = uVar11 ^ uVar16;
  uVar7 = uVar11 >> 0x20 | uVar11 << 0x20;
  local_188[3] = local_188[3] + uVar7;
  uVar15 = uVar15 ^ local_188[3];
  uVar9 = uVar15 >> 0x18 | uVar15 << 0x28;
  uVar13 = uVar16 + uVar9 + local_138[7];
  uVar7 = uVar7 ^ uVar13;
  uVar7 = uVar7 >> 0x10 | uVar7 << 0x30;
  local_188[3] = local_188[3] + uVar7;
  uVar7 = uVar7 ^ uVar2;
  uVar9 = uVar9 ^ local_188[3];
  uVar11 = uVar9 >> 0x3f | uVar9 << 1;
  uVar7 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[2] = local_188[2] + uVar7;
  uVar16 = uVar14 + uVar11 + local_138[0xc];
  uVar4 = uVar4 ^ local_188[2];
  uVar4 = uVar4 >> 0x18 | uVar4 << 0x28;
  uVar2 = uVar2 + uVar4 + local_138[9];
  uVar7 = uVar7 ^ uVar2;
  uVar9 = uVar7 >> 0x10 | uVar7 << 0x30;
  local_188[2] = uVar9 + local_188[2];
  uVar4 = local_188[2] ^ uVar4;
  uVar14 = uVar4 >> 0x3f | uVar4 << 1;
  uVar15 = uVar12 + local_138[10] + uVar3;
  uVar10 = uVar10 ^ uVar15;
  uVar7 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[3] = local_188[3] + uVar7;
  uVar3 = uVar3 ^ local_188[3];
  uVar4 = uVar3 >> 0x18 | uVar3 << 0x28;
  uVar12 = uVar15 + uVar4 + local_138[0xb];
  uVar7 = uVar7 ^ uVar12;
  uVar7 = uVar7 >> 0x10 | uVar7 << 0x30;
  local_188[3] = local_188[3] + uVar7;
  uVar4 = local_188[3] ^ uVar4;
  uVar15 = uVar4 >> 0x3f | uVar4 << 1;
  uVar5 = uVar5 ^ uVar16;
  uVar4 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar4;
  uVar11 = uVar11 ^ local_188[0];
  uVar3 = uVar11 >> 0x18 | uVar11 << 0x28;
  uVar16 = uVar16 + uVar3 + local_138[0xd];
  uVar4 = uVar4 ^ uVar16;
  uVar4 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[0] = local_188[0] + uVar4;
  uVar3 = uVar3 ^ local_188[0];
  uVar10 = uVar3 >> 0x3f | uVar3 << 1;
  uVar5 = uVar13 + uVar8 + local_138[0xe];
  uVar6 = uVar6 ^ uVar5;
  uVar3 = uVar6 >> 0x20 | uVar6 << 0x20;
  local_188[1] = local_188[1] + uVar3;
  uVar8 = uVar8 ^ local_188[1];
  uVar6 = uVar8 >> 0x18 | uVar8 << 0x28;
  uVar13 = uVar5 + local_138[0xf] + uVar6;
  uVar3 = uVar3 ^ uVar13;
  uVar8 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[1] = local_188[1] + uVar8;
  uVar6 = uVar6 ^ local_188[1];
  uVar5 = uVar6 >> 0x3f | uVar6 << 1;
  uVar2 = uVar2 + uVar5 + local_138[0xe];
  uVar7 = uVar7 ^ uVar2;
  uVar3 = uVar7 >> 0x20 | uVar7 << 0x20;
  local_188[0] = local_188[0] + uVar3;
  uVar5 = uVar5 ^ local_188[0];
  uVar5 = uVar5 >> 0x18 | uVar5 << 0x28;
  uVar2 = uVar2 + local_138[10] + uVar5;
  uVar3 = uVar3 ^ uVar2;
  uVar3 = uVar3 >> 0x10 | uVar3 << 0x30;
  local_188[0] = uVar3 + local_188[0];
  uVar5 = local_188[0] ^ uVar5;
  uVar6 = uVar5 >> 0x3f | uVar5 << 1;
  uVar5 = uVar12 + uVar14 + local_138[4];
  uVar4 = uVar4 ^ uVar5;
  uVar4 = uVar4 >> 0x20 | uVar4 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar14 = uVar14 ^ local_188[1];
  uVar7 = uVar14 >> 0x18 | uVar14 << 0x28;
  uVar11 = uVar5 + uVar7 + local_138[8];
  uVar4 = uVar4 ^ uVar11;
  uVar5 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = uVar5 + local_188[1];
  uVar7 = local_188[1] ^ uVar7;
  uVar7 = uVar7 >> 0x3f | uVar7 << 1;
  uVar2 = uVar2 + uVar7 + local_138[1];
  uVar12 = uVar16 + uVar15 + local_138[9];
  uVar8 = uVar8 ^ uVar12;
  uVar4 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar15 = uVar15 ^ local_188[2];
  uVar14 = uVar15 >> 0x18 | uVar15 << 0x28;
  uVar15 = uVar12 + local_138[0xf] + uVar14;
  uVar4 = uVar4 ^ uVar15;
  uVar8 = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[2] = uVar8 + local_188[2];
  uVar14 = uVar14 ^ local_188[2];
  uVar14 = uVar14 >> 0x3f | uVar14 << 1;
  uVar11 = uVar11 + uVar14 + local_138[0];
  uVar12 = uVar13 + uVar10 + local_138[0xd];
  uVar9 = uVar9 ^ uVar12;
  uVar9 = uVar9 >> 0x20 | uVar9 << 0x20;
  local_188[3] = local_188[3] + uVar9;
  uVar10 = uVar10 ^ local_188[3];
  uVar4 = uVar10 >> 0x18 | uVar10 << 0x28;
  uVar12 = uVar12 + uVar4 + local_138[6];
  uVar9 = uVar9 ^ uVar12;
  uVar10 = uVar9 >> 0x10 | uVar9 << 0x30;
  local_188[3] = local_188[3] + uVar10;
  uVar10 = uVar10 ^ uVar2;
  uVar4 = uVar4 ^ local_188[3];
  uVar9 = uVar4 >> 0x3f | uVar4 << 1;
  uVar4 = uVar10 >> 0x20 | uVar10 << 0x20;
  local_188[2] = local_188[2] + uVar4;
  uVar10 = uVar15 + uVar9 + local_138[0xb];
  uVar7 = uVar7 ^ local_188[2];
  uVar7 = uVar7 >> 0x18 | uVar7 << 0x28;
  local_1c8[0] = uVar2 + uVar7 + local_138[0xc];
  uVar4 = local_1c8[0] ^ uVar4;
  local_188[7] = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[2] = local_188[7] + local_188[2];
  local_188[2] = local_188[2] ^ uVar7;
  local_1c8[5] = local_188[2] >> 0x3f | local_188[2] << 1;
  uVar3 = uVar3 ^ uVar11;
  uVar2 = uVar3 >> 0x20 | uVar3 << 0x20;
  local_188[3] = local_188[3] + uVar2;
  uVar14 = uVar14 ^ local_188[3];
  uVar4 = uVar14 >> 0x18 | uVar14 << 0x28;
  local_1c8[1] = uVar11 + uVar4 + local_138[2];
  uVar2 = local_1c8[1] ^ uVar2;
  local_188[4] = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[3] = local_188[4] + local_188[3];
  local_188[3] = local_188[3] ^ uVar4;
  local_1c8[6] = local_188[3] >> 0x3f | local_188[3] << 1;
  uVar5 = uVar5 ^ uVar10;
  uVar2 = uVar5 >> 0x20 | uVar5 << 0x20;
  local_188[0] = local_188[0] + uVar2;
  uVar9 = uVar9 ^ local_188[0];
  uVar4 = uVar9 >> 0x18 | uVar9 << 0x28;
  local_1c8[2] = uVar10 + uVar4 + local_138[7];
  uVar2 = local_1c8[2] ^ uVar2;
  local_188[5] = uVar2 >> 0x10 | uVar2 << 0x30;
  local_188[0] = local_188[5] + local_188[0];
  local_188[0] = local_188[0] ^ uVar4;
  local_1c8[7] = local_188[0] >> 0x3f | local_188[0] << 1;
  uVar3 = uVar12 + uVar6 + local_138[5];
  uVar8 = uVar8 ^ uVar3;
  uVar4 = uVar8 >> 0x20 | uVar8 << 0x20;
  local_188[1] = local_188[1] + uVar4;
  uVar6 = uVar6 ^ local_188[1];
  uVar2 = uVar6 >> 0x18 | uVar6 << 0x28;
  local_1c8[3] = uVar3 + uVar2 + local_138[3];
  uVar4 = local_1c8[3] ^ uVar4;
  local_188[6] = uVar4 >> 0x10 | uVar4 << 0x30;
  local_188[1] = local_188[6] + local_188[1];
  local_188[1] = local_188[1] ^ uVar2;
  local_1c8[4] = local_188[1] >> 0x3f | local_188[1] << 1;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(ulong *)((long)md + lVar1 * 8) =
         local_1c8[lVar1] ^ *(ulong *)((long)md + lVar1 * 8) ^ local_188[lVar1];
  }
  return 8;
}

Assistant:

static int blake2b_compress(hash_state *md, const unsigned char *buf)
#endif
{
   ulong64 m[16];
   ulong64 v[16];
   unsigned long i;

   for (i = 0; i < 16; ++i) {
      LOAD64L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i) {
      v[i] = md->blake2b.h[i];
   }

   v[8] = blake2b_IV[0];
   v[9] = blake2b_IV[1];
   v[10] = blake2b_IV[2];
   v[11] = blake2b_IV[3];
   v[12] = blake2b_IV[4] ^ md->blake2b.t[0];
   v[13] = blake2b_IV[5] ^ md->blake2b.t[1];
   v[14] = blake2b_IV[6] ^ md->blake2b.f[0];
   v[15] = blake2b_IV[7] ^ md->blake2b.f[1];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);
   ROUND(10);
   ROUND(11);

   for (i = 0; i < 8; ++i) {
      md->blake2b.h[i] = md->blake2b.h[i] ^ v[i] ^ v[i + 8];
   }
   return CRYPT_OK;
}